

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O3

void __thiscall spoa::Graph::Graph(Graph *this)

{
  pointer piVar1;
  
  this->num_codes_ = 0;
  (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  piVar1 = (pointer)operator_new(0x400);
  (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = piVar1;
  (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar1 + 0x100;
  memset(piVar1,0xff,0x400);
  (this->coder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar1 + 0x100;
  (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  piVar1 = (pointer)operator_new(0x400);
  (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = piVar1;
  (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = piVar1 + 0x100;
  memset(piVar1,0xff,0x400);
  (this->decoder_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar1 + 0x100;
  (this->sequences_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequences_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequences_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->edges_).
  super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges_).
  super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges_).
  super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges_).
  super__Vector_base<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>,_std::allocator<std::unique_ptr<spoa::Graph::Edge,_std::default_delete<spoa::Graph::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rank_to_node_).
  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rank_to_node_).
  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->rank_to_node_).
  super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->consensus_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->consensus_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->consensus_).super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Graph::Graph()
    : num_codes_(0),
      coder_(256, -1),
      decoder_(256, -1),
      sequences_(),
      nodes_(),
      edges_(),
      rank_to_node_(),
      consensus_() {
}